

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generation_iterator.cpp
# Opt level: O0

generation_iterator __thiscall pstore::generation_container::end(generation_container *this)

{
  typed_address<pstore::trailer> pos;
  not_null<const_pstore::database_*> local_28;
  generation_container *local_20;
  generation_container *this_local;
  
  local_20 = this;
  gsl::not_null<const_pstore::database_*>::not_null(&local_28,this->db_);
  pos = typed_address<pstore::trailer>::null();
  generation_iterator::generation_iterator((generation_iterator *)&this_local,local_28,pos);
  return _this_local;
}

Assistant:

generation_iterator generation_container::end () {
        return {&db_, pstore::typed_address<pstore::trailer>::null ()};
    }